

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

void __thiscall tinyusdz::value::matrix4f::matrix4f(matrix4f *this)

{
  matrix4f *this_local;
  
  this->m[0][0] = 1.0;
  this->m[0][1] = 0.0;
  this->m[0][2] = 0.0;
  this->m[0][3] = 0.0;
  this->m[1][0] = 0.0;
  this->m[1][1] = 1.0;
  this->m[1][2] = 0.0;
  this->m[1][3] = 0.0;
  this->m[2][0] = 0.0;
  this->m[2][1] = 0.0;
  this->m[2][2] = 1.0;
  this->m[2][3] = 0.0;
  this->m[3][0] = 0.0;
  this->m[3][1] = 0.0;
  this->m[3][2] = 0.0;
  this->m[3][3] = 1.0;
  return;
}

Assistant:

matrix4f() {
    m[0][0] = 1.0f;
    m[0][1] = 0.0f;
    m[0][2] = 0.0f;
    m[0][3] = 0.0f;

    m[1][0] = 0.0f;
    m[1][1] = 1.0f;
    m[1][2] = 0.0f;
    m[1][3] = 0.0f;

    m[2][0] = 0.0f;
    m[2][1] = 0.0f;
    m[2][2] = 1.0f;
    m[2][3] = 0.0f;

    m[3][0] = 0.0f;
    m[3][1] = 0.0f;
    m[3][2] = 0.0f;
    m[3][3] = 1.0f;
  }